

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ColourGuard * __thiscall
Catch::ColourImpl::ColourGuard::operator=(ColourGuard *this,ColourGuard *rhs)

{
  bool bVar1;
  Code CVar2;
  ColourImpl *pCVar3;
  
  pCVar3 = this->m_colourImpl;
  this->m_colourImpl = rhs->m_colourImpl;
  rhs->m_colourImpl = pCVar3;
  CVar2 = this->m_code;
  this->m_code = rhs->m_code;
  rhs->m_code = CVar2;
  bVar1 = this->m_engaged;
  this->m_engaged = rhs->m_engaged;
  rhs->m_engaged = bVar1;
  return this;
}

Assistant:

ColourImpl::ColourGuard&
    ColourImpl::ColourGuard::operator=( ColourGuard&& rhs ) noexcept {
        using std::swap;
        swap( m_colourImpl, rhs.m_colourImpl );
        swap( m_code, rhs.m_code );
        swap( m_engaged, rhs.m_engaged );

        return *this;
    }